

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

void __thiscall curlpp::HttpPost::HttpPost(HttpPost *this,Forms *posts)

{
  Forms *this_00;
  FormPart *pFVar1;
  _List_node_base *p_Var2;
  
  this_00 = &this->mForms;
  this->mFirst = (curl_httppost *)0x0;
  this->mLast = (curl_httppost *)0x0;
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mForms).
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ._M_impl._M_node._M_size = 0;
  p_Var2 = (_List_node_base *)posts;
  while (p_Var2 = (((_List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)posts) {
    std::__cxx11::
    list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    ::push_back(this_00,(value_type *)(p_Var2 + 1));
    pFVar1 = utilspp::clone_ptr<curlpp::FormPart>::operator->
                       ((clone_ptr<curlpp::FormPart> *)
                        ((this->mForms).
                         super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + 1));
    (*pFVar1->_vptr_FormPart[3])(pFVar1,this,&this->mLast);
  }
  return;
}

Assistant:

curlpp::HttpPost::HttpPost(const Forms & posts)
  : mFirst(NULL)
  , mLast(NULL)
{
  Forms::const_iterator pos;
  for(pos = posts.begin(); pos != posts.end(); pos++) 
  {
    mForms.push_back(*pos);
    mForms.back()->add(&mFirst, &mLast);
  } 
}